

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_next_window.cpp
# Opt level: O1

vector<rw::Window_*,_std::allocator<rw::Window_*>_> *
rw::window_with_greatest_perpendicular_overlap
          (vector<rw::Window_*,_std::allocator<rw::Window_*>_> *__return_storage_ptr__,
          Window *focused_window,vector<rw::Window_*,_std::allocator<rw::Window_*>_> *other_windows,
          Direction *direction)

{
  pointer *pppWVar1;
  pointer ppWVar2;
  pointer ppWVar3;
  iterator __position;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int unaff_EBP;
  byte bVar7;
  Window **other;
  pointer __args;
  tuple<int,_int> other_range;
  tuple<int,_int> focused_range;
  _Tuple_impl<0UL,_int,_int> local_50;
  _Tuple_impl<0UL,_int,_int> local_48;
  _Tuple_impl<0UL,_int,_int> local_40;
  _Tuple_impl<0UL,_int,_int> local_38;
  
  (**(code **)(*(long *)direction + 0x28))(&local_38,direction,focused_window);
  (__return_storage_ptr__->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __args = (other_windows->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ppWVar2 = (other_windows->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  if (__args != ppWVar2) {
    bVar7 = 0;
    do {
      (**(code **)(*(long *)direction + 0x28))(&local_40,direction,*__args);
      local_48 = local_38;
      local_50 = local_40;
      iVar4 = overlap_length((tuple<int,_int> *)&local_48,(tuple<int,_int> *)&local_50);
      if (!(bool)(bVar7 & iVar4 - unaff_EBP < 0x33)) {
        ppWVar3 = (__return_storage_ptr__->
                  super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        bVar7 = 1;
        unaff_EBP = iVar4;
        if ((__return_storage_ptr__->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>
            )._M_impl.super__Vector_impl_data._M_finish != ppWVar3) {
          (__return_storage_ptr__->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>).
          _M_impl.super__Vector_impl_data._M_finish = ppWVar3;
        }
      }
      uVar5 = iVar4 - unaff_EBP;
      uVar6 = -uVar5;
      if (0 < (int)uVar5) {
        uVar6 = uVar5;
      }
      if (uVar6 < 0x33) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<rw::Window*,std::allocator<rw::Window*>>::_M_realloc_insert<rw::Window*const&>
                    ((vector<rw::Window*,std::allocator<rw::Window*>> *)__return_storage_ptr__,
                     __position,__args);
        }
        else {
          *__position._M_current = *__args;
          pppWVar1 = &(__return_storage_ptr__->
                      super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppWVar1 = *pppWVar1 + 1;
        }
      }
      __args = __args + 1;
    } while (__args != ppWVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Window*> window_with_greatest_perpendicular_overlap(
            Window* focused_window,
            const vector<Window*> other_windows,
            Direction * direction)
    {
        auto focused_range = direction->perpendicular_range(focused_window);

        bool best_overlap_set = false;
        int best_overlap;
        vector<Window*> best_windows;

        for (auto& other : other_windows) {
            auto other_range = direction->perpendicular_range(other);

            int overlap = overlap_length(focused_range, other_range);
            // Note: small overlap differences as treated as if there was no
            // difference. This is because in practice these small differences
            // are side effects of splitting the screen when the height or width
            // is not even.
            const int small_difference = 50;

            if (!best_overlap_set || (overlap - best_overlap > small_difference)) {
                best_overlap_set = true;
                best_overlap = overlap;
                best_windows.clear();
            }

            if (abs(overlap - best_overlap) <= small_difference) {
                best_windows.push_back(other);
            }
        }

        return best_windows;
    }